

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O3

char * mbedtls_ssl_get_ciphersuite_name(int ciphersuite_id)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  
  iVar2 = 0xc009;
  pmVar1 = ciphersuite_definitions;
  do {
    pmVar1 = pmVar1 + 1;
    if (iVar2 == ciphersuite_id) {
      return pmVar1[-1].name;
    }
    iVar2 = pmVar1->id;
  } while (iVar2 != 0);
  return "unknown";
}

Assistant:

const char *mbedtls_ssl_get_ciphersuite_name( const int ciphersuite_id )
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_id( ciphersuite_id );

    if( cur == NULL )
        return( "unknown" );

    return( cur->name );
}